

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

int __thiscall doctest::Context::run(Context *this)

{
  int *piVar1;
  uint *puVar2;
  uint uVar3;
  pointer pvVar4;
  const_iterator __position;
  pointer ppIVar5;
  TestCase *pTVar6;
  ContextState *pCVar7;
  vector<doctest::String,_std::allocator<doctest::String>_> *filters;
  char *pcVar8;
  __normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
  __last;
  undefined8 uVar9;
  bool bVar10;
  char cVar11;
  bool bVar12;
  int iVar13;
  undefined1 *puVar14;
  ContextState *pCVar15;
  __normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
  _Var16;
  size_t sVar17;
  const_iterator cVar18;
  long lVar19;
  int result;
  uint uVar20;
  code *__comp;
  _Ios_Openmode _Var21;
  String *name;
  ContextState *pCVar22;
  IReporter **curr;
  pointer ppIVar23;
  byte bVar24;
  IReporter **curr_rep;
  ulong uVar25;
  long in_FS_OFFSET;
  vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
  testArray;
  vector<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_> queryResults
  ;
  timeval t;
  stack_t sigStack;
  set<doctest::String,_std::less<doctest::String>,_std::allocator<doctest::String>_>
  testSuitesPassingFilt;
  fstream fstr;
  char local_389;
  __normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
  local_378;
  __normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
  _Stack_370;
  long local_368;
  undefined1 local_358 [32];
  undefined1 local_338 [16];
  undefined4 local_328;
  undefined4 uStack_324;
  int local_2b0;
  TestCase **local_2a0;
  char *local_298;
  TestCase **local_290;
  sigaltstack local_288;
  undefined1 local_270 [8];
  undefined1 local_268 [32];
  anon_union_24_2_13149d16_for_String_2 local_248;
  ostream local_230;
  
  pCVar15 = detail::g_cs;
  detail::g_cs = this->p;
  is_running_in_test = 1;
  pCVar22 = this->p;
  *(bool *)(in_FS_OFFSET + -0x40) = (pCVar22->super_ContextOptions).no_colors;
  (pCVar22->super_TestRunStats).numAsserts = 0;
  (pCVar22->super_TestRunStats).numAssertsFailed = 0;
  (pCVar22->super_CurrentTestCaseStats).numAssertsCurrentTest = 0;
  (pCVar22->super_CurrentTestCaseStats).numAssertsFailedCurrentTest = 0;
  (pCVar22->super_TestRunStats).numTestCases = 0;
  (pCVar22->super_TestRunStats).numTestCasesPassingFilters = 0;
  (pCVar22->super_TestRunStats).numTestSuitesPassingFilters = 0;
  (pCVar22->super_TestRunStats).numTestCasesFailed = 0;
  std::fstream::fstream(local_248.buf + 8);
  pCVar22 = this->p;
  if ((pCVar22->super_ContextOptions).cout == (ostream *)0x0) {
    if ((pCVar22->super_ContextOptions).quiet == true) {
      puVar14 = discardOut;
    }
    else {
      bVar24 = (pCVar22->super_ContextOptions).out.field_0.buf[0x17];
      if ((char)bVar24 < '\0') {
        uVar20 = (pCVar22->super_ContextOptions).out.field_0.data.size;
      }
      else {
        uVar20 = 0x17 - (bVar24 & 0x1f);
      }
      if (uVar20 != 0) {
        if ((char)bVar24 < '\0') {
          _Var21 = (_Ios_Openmode)*(undefined8 *)&(pCVar22->super_ContextOptions).out.field_0;
        }
        else {
          _Var21 = (int)pCVar22 + (_S_trunc|_S_in);
        }
        std::fstream::open(local_248.buf + 8,_Var21);
        (this->p->super_ContextOptions).cout = &local_230;
        goto LAB_0010f959;
      }
      puVar14 = (undefined1 *)&std::cout;
    }
    (pCVar22->super_ContextOptions).cout = (ostream *)puVar14;
  }
LAB_0010f959:
  pCVar22 = (anonymous_namespace)::FatalConditionHandler::altStackSize;
  (anonymous_namespace)::FatalConditionHandler::altStackMem =
       operator_new__((ulong)(anonymous_namespace)::FatalConditionHandler::altStackSize);
  pvVar4 = (this->p->filters).
           super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pvVar4[8].super__Vector_base<doctest::String,_std::allocator<doctest::String>_>._M_impl.
      super__Vector_impl_data._M_start ==
      pvVar4[8].super__Vector_base<doctest::String,_std::allocator<doctest::String>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    String::String((String *)local_338,"console",7);
    pCVar22 = (ContextState *)(pvVar4 + 8);
    std::vector<doctest::String,_std::allocator<doctest::String>_>::emplace_back<doctest::String>
              ((vector<doctest::String,_std::allocator<doctest::String>_> *)pCVar22,
               (String *)local_338);
    if (((long)_local_328 < 0) &&
       (pCVar22 = (ContextState *)local_338._0_8_,
       (ContextState *)local_338._0_8_ != (ContextState *)0x0)) {
      operator_delete__((void *)local_338._0_8_);
    }
  }
  local_358._24_8_ = pCVar15;
  anon_unknown_14::getReporters();
  if ((_Rb_tree_header *)
      anon_unknown_14::getReporters::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &anon_unknown_14::getReporters::data._M_t._M_impl.super__Rb_tree_header) {
    pCVar15 = (ContextState *)
              anon_unknown_14::getReporters::data._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_left;
    do {
      pCVar22 = pCVar15;
      if ((pCVar22->super_ContextOptions).out.field_0.buf[0x17] < '\0') {
        name = (String *)(pCVar22->super_ContextOptions).out.field_0.data.ptr;
      }
      else {
        name = &(pCVar22->super_ContextOptions).out;
      }
      pCVar15 = this->p;
      bVar10 = anon_unknown_14::matchesAny
                         ((char *)name,
                          (pCVar15->filters).
                          super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 8,false,
                          (pCVar15->super_ContextOptions).case_sensitive);
      if (bVar10) {
        local_338._0_8_ =
             (**(code **)&(pCVar22->super_ContextOptions).order_by.field_0)(detail::g_cs);
        std::vector<doctest::IReporter*,std::allocator<doctest::IReporter*>>::
        emplace_back<doctest::IReporter*>
                  ((vector<doctest::IReporter*,std::allocator<doctest::IReporter*>> *)
                   &pCVar15->reporters_currently_used,(IReporter **)local_338);
      }
      pCVar15 = (ContextState *)std::_Rb_tree_increment((_Rb_tree_node_base *)pCVar22);
    } while (pCVar15 !=
             (ContextState *)&anon_unknown_14::getReporters::data._M_t._M_impl.super__Rb_tree_header
            );
  }
  anon_unknown_14::getListeners();
  if ((_Rb_tree_header *)
      anon_unknown_14::getListeners::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &anon_unknown_14::getListeners::data._M_t._M_impl.super__Rb_tree_header) {
    pCVar15 = (ContextState *)
              anon_unknown_14::getListeners::data._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_left;
    do {
      pCVar22 = pCVar15;
      pCVar15 = this->p;
      __position._M_current =
           (pCVar15->reporters_currently_used).
           super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_338._0_8_ = (**(code **)&(pCVar22->super_ContextOptions).order_by.field_0)(detail::g_cs)
      ;
      std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::_M_insert_rval
                (&pCVar15->reporters_currently_used,__position,(value_type *)local_338);
      pCVar15 = (ContextState *)std::_Rb_tree_increment((_Rb_tree_node_base *)pCVar22);
    } while (pCVar15 !=
             (ContextState *)&anon_unknown_14::getListeners::data._M_t._M_impl.super__Rb_tree_header
            );
  }
  pCVar15 = this->p;
  if (((((pCVar15->super_ContextOptions).no_run != false) ||
       ((pCVar15->super_ContextOptions).version != false)) ||
      ((pCVar15->super_ContextOptions).help != false)) ||
     ((pCVar15->super_ContextOptions).list_reporters == true)) {
    ppIVar23 = (detail::g_cs->reporters_currently_used).
               super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppIVar5 = (detail::g_cs->reporters_currently_used).
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppIVar23 != ppIVar5) {
      do {
        local_338._0_8_ = (ContextState *)0x0;
        local_338._8_8_ = (void *)0x0;
        _local_328 = 0;
        (**(*ppIVar23)->_vptr_IReporter)(*ppIVar23,local_338);
        ppIVar23 = ppIVar23 + 1;
      } while (ppIVar23 != ppIVar5);
    }
    if ((anonymous_namespace)::FatalConditionHandler::altStackMem != (void *)0x0) {
      operator_delete__((anonymous_namespace)::FatalConditionHandler::altStackMem);
    }
    cVar11 = std::__basic_file<char>::is_open();
    uVar9 = local_358._24_8_;
    if (cVar11 != '\0') {
      std::fstream::close();
    }
    detail::g_cs = (ContextState *)uVar9;
    is_running_in_test = 0;
    ppIVar5 = (this->p->reporters_currently_used).
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppIVar23 = (this->p->reporters_currently_used).
                    super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppIVar23 != ppIVar5;
        ppIVar23 = ppIVar23 + 1) {
      if (*ppIVar23 != (IReporter *)0x0) {
        (*(*ppIVar23)->_vptr_IReporter[0xd])();
      }
    }
    pCVar22 = this->p;
    ppIVar23 = (pCVar22->reporters_currently_used).
               super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if ((pCVar22->reporters_currently_used).
        super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppIVar23) {
      (pCVar22->reporters_currently_used).
      super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppIVar23;
    }
    if (((pCVar22->super_TestRunStats).numTestCasesFailed == 0) ||
       (iVar13 = 1, (pCVar22->super_ContextOptions).no_exitcode == true)) {
      iVar13 = 0;
    }
    goto LAB_0010fbc8;
  }
  local_378._M_current = (TestCase **)0x0;
  _Stack_370._M_current = (TestCase **)0x0;
  local_368 = 0;
  detail::getRegisteredTests();
  if ((_Rb_tree_header *)
      detail::getRegisteredTests::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &detail::getRegisteredTests::data._M_t._M_impl.super__Rb_tree_header) {
    pCVar15 = (ContextState *)
              detail::getRegisteredTests::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      pCVar22 = pCVar15;
      local_338._0_8_ = &(pCVar22->super_ContextOptions).currentTest;
      std::vector<doctest::detail::TestCase_const*,std::allocator<doctest::detail::TestCase_const*>>
      ::emplace_back<doctest::detail::TestCase_const*>
                ((vector<doctest::detail::TestCase_const*,std::allocator<doctest::detail::TestCase_const*>>
                  *)&local_378,(TestCase **)local_338);
      pCVar15 = (ContextState *)std::_Rb_tree_increment((_Rb_tree_node_base *)pCVar22);
    } while (pCVar15 !=
             (ContextState *)&detail::getRegisteredTests::data._M_t._M_impl.super__Rb_tree_header);
  }
  __last._M_current = _Stack_370._M_current;
  _Var16._M_current = local_378._M_current;
  pCVar15 = this->p;
  (pCVar15->super_TestRunStats).numTestCases =
       (uint)((ulong)((long)_Stack_370._M_current - (long)local_378._M_current) >> 3);
  if (_Stack_370._M_current != local_378._M_current) {
    pCVar22 = (ContextState *)&(pCVar15->super_ContextOptions).order_by;
    iVar13 = String::compare((String *)pCVar22,"file",true);
    if (iVar13 == 0) {
      __comp = anon_unknown_14::fileOrderComparator;
    }
    else {
      iVar13 = String::compare((String *)pCVar22,"suite",true);
      if (iVar13 == 0) {
        __comp = anon_unknown_14::suiteOrderComparator;
      }
      else {
        iVar13 = String::compare((String *)pCVar22,"name",true);
        if (iVar13 != 0) {
          iVar13 = String::compare((String *)pCVar22,"rand",true);
          if (iVar13 == 0) {
            uVar20 = (pCVar15->super_ContextOptions).rand_seed;
            pCVar22 = (ContextState *)(ulong)uVar20;
            srand(uVar20);
            _Var16._M_current = local_378._M_current;
            for (uVar25 = (long)_Stack_370._M_current - (long)local_378._M_current >> 3; uVar25 != 1
                ; uVar25 = uVar25 - 1) {
              iVar13 = rand();
              pTVar6 = _Var16._M_current[uVar25 - 1];
              iVar13 = (int)((ulong)(long)iVar13 % uVar25);
              _Var16._M_current[uVar25 - 1] = _Var16._M_current[iVar13];
              _Var16._M_current[iVar13] = pTVar6;
            }
          }
          goto LAB_0010fd4d;
        }
        __comp = anon_unknown_14::nameOrderComparator;
      }
    }
    std::
    sort<__gnu_cxx::__normal_iterator<doctest::detail::TestCase_const**,std::vector<doctest::detail::TestCase_const*,std::allocator<doctest::detail::TestCase_const*>>>,bool(*)(doctest::detail::TestCase_const*,doctest::detail::TestCase_const*)>
              (_Var16,__last,__comp);
    pCVar22 = (ContextState *)_Var16._M_current;
  }
LAB_0010fd4d:
  local_268._16_8_ = local_268;
  local_268[0] = '\0';
  local_268[1] = '\0';
  local_268[2] = '\0';
  local_268[3] = '\0';
  local_268._8_4_ = (__atomic_base<int>)0x0;
  local_268[0xc] = '\0';
  local_268[0xd] = '\0';
  local_268[0xe] = '\0';
  local_268[0xf] = '\0';
  local_248.data.ptr = (char *)0x0;
  pCVar15 = this->p;
  local_389 = '\x01';
  if (((pCVar15->super_ContextOptions).count == false) &&
     ((pCVar15->super_ContextOptions).list_test_cases == false)) {
    local_389 = (pCVar15->super_ContextOptions).list_test_suites;
  }
  local_358._0_8_ = (ostream *)0x0;
  local_358._8_8_ = (char *)0x0;
  local_358._16_8_ = 0;
  local_268._24_8_ = local_268._16_8_;
  if (local_389 == '\0') {
    ppIVar5 = (detail::g_cs->reporters_currently_used).
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppIVar23 = (detail::g_cs->reporters_currently_used).
                    super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppIVar23 != ppIVar5;
        ppIVar23 = ppIVar23 + 1) {
      pCVar22 = (ContextState *)*ppIVar23;
      (**(code **)&((pCVar22->super_ContextOptions).cout)->field_0x8)();
    }
  }
  local_2a0 = _Stack_370._M_current;
  _Var16._M_current = local_378._M_current;
  if (local_378._M_current != _Stack_370._M_current) {
    do {
      pCVar15 = (ContextState *)*_Var16._M_current;
      if ((pCVar15->super_ContextOptions).out.field_0.buf[0x10] == '\x01') {
        bVar24 = (this->p->super_ContextOptions).no_skip ^ 1;
      }
      else {
        bVar24 = 0;
      }
      pCVar22 = pCVar15;
      if ((pCVar15->super_ContextOptions).binary_name.field_0.buf[0xf] < '\0') {
        pCVar22 = (ContextState *)(pCVar15->super_ContextOptions).cout;
      }
      pCVar7 = this->p;
      filters = (pCVar7->filters).
                super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      bVar10 = (pCVar7->super_ContextOptions).case_sensitive;
      local_290 = _Var16._M_current;
      bVar12 = anon_unknown_14::matchesAny((char *)pCVar22,filters,true,bVar10);
      if (!bVar12) {
        bVar24 = 1;
      }
      bVar12 = anon_unknown_14::matchesAny((char *)pCVar22,filters + 1,false,bVar10);
      if (bVar12) {
        bVar24 = 1;
      }
      pcVar8 = (pCVar15->super_ContextOptions).out.field_0.data.ptr;
      bVar12 = anon_unknown_14::matchesAny(pcVar8,filters + 2,true,bVar10);
      if (!bVar12) {
        bVar24 = 1;
      }
      local_298 = pcVar8;
      bVar12 = anon_unknown_14::matchesAny(pcVar8,filters + 3,false,bVar10);
      if (bVar12) {
        bVar24 = 1;
      }
      pCVar22 = (ContextState *)(pCVar15->super_ContextOptions).currentTest;
      bVar12 = anon_unknown_14::matchesAny((char *)pCVar22,filters + 4,true,bVar10);
      if (!bVar12) {
        bVar24 = 1;
      }
      bVar10 = anon_unknown_14::matchesAny((char *)pCVar22,filters + 5,false,bVar10);
      pcVar8 = local_298;
      if (bVar10) {
        bVar24 = 1;
      }
      if ((bVar24 & 1) == 0) {
        puVar2 = &(pCVar7->super_TestRunStats).numTestCasesPassingFilters;
        *puVar2 = *puVar2 + 1;
      }
      uVar20 = (pCVar7->super_ContextOptions).last;
      uVar3 = (pCVar7->super_TestRunStats).numTestCasesPassingFilters;
      if (((uVar20 < uVar3) && ((pCVar7->super_ContextOptions).first <= uVar20)) ||
         (uVar3 < (pCVar7->super_ContextOptions).first)) {
        bVar24 = 1;
      }
      lVar19 = 0;
      if ((bVar24 & 1) == 0) {
        if ((pCVar7->super_ContextOptions).count == false) {
          if ((pCVar7->super_ContextOptions).list_test_cases == true) {
            pCVar22 = (ContextState *)local_358;
            local_338._0_8_ = pCVar15;
            std::vector<doctest::TestCaseData_const*,std::allocator<doctest::TestCaseData_const*>>::
            emplace_back<doctest::TestCaseData_const*>
                      ((vector<doctest::TestCaseData_const*,std::allocator<doctest::TestCaseData_const*>>
                        *)pCVar22,(TestCaseData **)local_338);
          }
          else if ((pCVar7->super_ContextOptions).list_test_suites == true) {
            sVar17 = strlen(local_298);
            String::String((String *)local_338,pcVar8,(uint)sVar17);
            pCVar22 = (ContextState *)local_270;
            cVar18 = std::
                     _Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
                     ::find((_Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
                             *)pCVar22,(String *)local_338);
            if (cVar18._M_node == (_Base_ptr)local_268) {
              cVar11 = *(pCVar15->super_ContextOptions).out.field_0.data.ptr;
              if (((long)_local_328 < 0) &&
                 (pCVar22 = (ContextState *)local_338._0_8_,
                 (ContextState *)local_338._0_8_ != (ContextState *)0x0)) {
                operator_delete__((void *)local_338._0_8_);
              }
              if (cVar11 != '\0') {
                local_338._0_8_ = pCVar15;
                std::
                vector<doctest::TestCaseData_const*,std::allocator<doctest::TestCaseData_const*>>::
                emplace_back<doctest::TestCaseData_const*>
                          ((vector<doctest::TestCaseData_const*,std::allocator<doctest::TestCaseData_const*>>
                            *)local_358,(TestCaseData **)local_338);
                pcVar8 = (pCVar15->super_ContextOptions).out.field_0.data.ptr;
                sVar17 = strlen(pcVar8);
                String::String((String *)local_338,pcVar8,(uint)sVar17);
                pCVar22 = (ContextState *)local_270;
                std::
                _Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
                ::_M_insert_unique<doctest::String>
                          ((_Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
                            *)pCVar22,(String *)local_338);
                if (((long)_local_328 < 0) &&
                   (pCVar22 = (ContextState *)local_338._0_8_,
                   (ContextState *)local_338._0_8_ != (ContextState *)0x0)) {
                  operator_delete__((void *)local_338._0_8_);
                }
                puVar2 = &(this->p->super_TestRunStats).numTestSuitesPassingFilters;
                *puVar2 = *puVar2 + 1;
              }
            }
            else if (((long)_local_328 < 0) &&
                    (pCVar22 = (ContextState *)local_338._0_8_,
                    (ContextState *)local_338._0_8_ != (ContextState *)0x0)) {
              operator_delete__((void *)local_338._0_8_);
            }
          }
          else {
            (pCVar7->super_ContextOptions).currentTest = (TestCase *)pCVar15;
            (pCVar7->super_CurrentTestCaseStats).failure_flags = 0;
            (pCVar7->super_CurrentTestCaseStats).seconds = 0.0;
            lVar19 = 0;
            do {
              LOCK();
              pcVar8 = (pCVar7->numAssertsFailedCurrentTest_atomic).m_atomics[0].padding +
                       lVar19 + -4;
              pcVar8[0] = '\0';
              pcVar8[1] = '\0';
              pcVar8[2] = '\0';
              pcVar8[3] = '\0';
              UNLOCK();
              lVar19 = lVar19 + 0x40;
            } while (lVar19 != 0x800);
            pCVar22 = this->p;
            lVar19 = 0;
            do {
              LOCK();
              pcVar8 = (pCVar22->numAssertsCurrentTest_atomic).m_atomics[0].padding + lVar19 + -4;
              pcVar8[0] = '\0';
              pcVar8[1] = '\0';
              pcVar8[2] = '\0';
              pcVar8[3] = '\0';
              UNLOCK();
              lVar19 = lVar19 + 0x40;
            } while (lVar19 != 0x800);
            std::
            _Rb_tree<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>,_std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>,_std::_Identity<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>,_std::less<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>,_std::allocator<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>_>
            ::clear(&(this->p->subcasesPassed)._M_t);
            ppIVar5 = (detail::g_cs->reporters_currently_used).
                      super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            for (ppIVar23 = (detail::g_cs->reporters_currently_used).
                            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                            ._M_impl.super__Vector_impl_data._M_start; ppIVar23 != ppIVar5;
                ppIVar23 = ppIVar23 + 1) {
              (*(*ppIVar23)->_vptr_IReporter[3])();
            }
            pCVar22 = this->p;
            gettimeofday((timeval *)local_338,(__timezone_ptr_t)0x0);
            (pCVar22->timer).m_ticks = (ticks_t)(local_338._0_8_ * 1000000 + local_338._8_8_);
            bVar10 = true;
            do {
              pCVar22 = this->p;
              pCVar22->should_reenter = false;
              pCVar22->subcasesCurrentMaxLevel = 0;
              std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>::
              _M_erase_at_end(&pCVar22->subcasesStack,
                              (pCVar22->subcasesStack).
                              super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                              ._M_impl.super__Vector_impl_data._M_start);
              LOCK();
              (this->p->shouldLogCurrentException)._M_base._M_i = true;
              UNLOCK();
              std::vector<doctest::String,_std::allocator<doctest::String>_>::_M_erase_at_end
                        (&this->p->stringifiedContexts,
                         (this->p->stringifiedContexts).
                         super__Vector_base<doctest::String,_std::allocator<doctest::String>_>.
                         _M_impl.super__Vector_impl_data._M_start);
              (anonymous_namespace)::FatalConditionHandler::isSet = 1;
              local_288.ss_sp = (anonymous_namespace)::FatalConditionHandler::altStackMem;
              local_288.ss_size = (size_t)(anonymous_namespace)::FatalConditionHandler::altStackSize
              ;
              local_288.ss_flags = 0;
              sigaltstack(&local_288,
                          (sigaltstack *)(anonymous_namespace)::FatalConditionHandler::oldSigStack);
              memset((sigaction *)local_338,0,0x98);
              local_338._0_8_ = anon_unknown_14::FatalConditionHandler::handleSignal;
              local_2b0 = 0x8000000;
              puVar14 = (anonymous_namespace)::FatalConditionHandler::oldSigActions;
              lVar19 = 0;
              do {
                sigaction(*(int *)((long)&(anonymous_namespace)::signalDefs + lVar19),
                          (sigaction *)local_338,(sigaction *)puVar14);
                lVar19 = lVar19 + 0x10;
                puVar14 = (undefined1 *)((long)puVar14 + 0x98);
              } while (lVar19 != 0x60);
              (**(code **)((long)&(pCVar15->super_ContextOptions).order_by.field_0 + 0x10))();
              anon_unknown_14::FatalConditionHandler::reset();
              anon_unknown_14::FatalConditionHandler::reset();
              pCVar22 = this->p;
              if (0 < (pCVar22->super_ContextOptions).abort_after) {
                iVar13 = 0;
                lVar19 = 0;
                do {
                  iVar13 = iVar13 + *(int *)((pCVar22->numAssertsFailedCurrentTest_atomic).m_atomics
                                             [0].padding + lVar19 + -4);
                  lVar19 = lVar19 + 0x40;
                } while (lVar19 != 0x800);
                if ((this->p->super_ContextOptions).abort_after <=
                    iVar13 + (pCVar22->super_TestRunStats).numAssertsFailed) {
                  piVar1 = &(this->p->super_CurrentTestCaseStats).failure_flags;
                  *(byte *)piVar1 = (byte)*piVar1 | 8;
                  bVar10 = false;
                }
              }
              if ((this->p->should_reenter == true) && (bVar10)) {
                ppIVar5 = (detail::g_cs->reporters_currently_used).
                          super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                for (ppIVar23 = (detail::g_cs->reporters_currently_used).
                                super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                                ._M_impl.super__Vector_impl_data._M_start; ppIVar23 != ppIVar5;
                    ppIVar23 = ppIVar23 + 1) {
                  (*(*ppIVar23)->_vptr_IReporter[4])(*ppIVar23,pCVar15);
                }
              }
              pCVar22 = this->p;
              if (pCVar22->should_reenter == false) {
                bVar10 = false;
              }
            } while (bVar10);
            detail::ContextState::finalizeTestCaseData(pCVar22);
            ppIVar5 = (detail::g_cs->reporters_currently_used).
                      super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            for (ppIVar23 = (detail::g_cs->reporters_currently_used).
                            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                            ._M_impl.super__Vector_impl_data._M_start; ppIVar23 != ppIVar5;
                ppIVar23 = ppIVar23 + 1) {
              pCVar22 = (ContextState *)*ppIVar23;
              (**(code **)&((pCVar22->super_ContextOptions).cout)->field_0x28)
                        (pCVar22,&detail::g_cs->super_CurrentTestCaseStats);
            }
            pCVar15 = this->p;
            (pCVar15->super_ContextOptions).currentTest = (TestCase *)0x0;
            iVar13 = (pCVar15->super_ContextOptions).abort_after;
            if ((iVar13 < 1) ||
               (lVar19 = 0xf, (pCVar15->super_TestRunStats).numAssertsFailed < iVar13)) {
              lVar19 = 0;
            }
          }
        }
      }
      else if (local_389 == '\0') {
        ppIVar5 = (detail::g_cs->reporters_currently_used).
                  super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        for (ppIVar23 = (detail::g_cs->reporters_currently_used).
                        super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppIVar23 != ppIVar5;
            ppIVar23 = ppIVar23 + 1) {
          pCVar22 = (ContextState *)*ppIVar23;
          (**(code **)((((String *)&(pCVar22->super_ContextOptions).cout)->field_0).data.ptr + 0x58)
          )(pCVar22,pCVar15);
        }
      }
    } while ((lVar19 == 0) && (_Var16._M_current = local_290 + 1, _Var16._M_current != local_2a0));
  }
  if (local_389 == '\0') {
    ppIVar5 = (detail::g_cs->reporters_currently_used).
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppIVar23 = (detail::g_cs->reporters_currently_used).
                    super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppIVar23 != ppIVar5;
        ppIVar23 = ppIVar23 + 1) {
      pCVar22 = (ContextState *)*ppIVar23;
      (**(code **)&((pCVar22->super_ContextOptions).cout)->field_0x10)
                (pCVar22,&detail::g_cs->super_TestRunStats);
    }
  }
  else {
    local_338._0_8_ = &detail::g_cs->super_TestRunStats;
    if (detail::g_cs == (ContextState *)0x0) {
      local_338._0_8_ = (ContextState *)0x0;
    }
    local_338._8_8_ = local_358._0_8_;
    local_328 = (int)((ulong)(local_358._8_8_ - local_358._0_8_) >> 3);
    ppIVar23 = (detail::g_cs->reporters_currently_used).
               super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppIVar5 = (detail::g_cs->reporters_currently_used).
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppIVar23 != ppIVar5) {
      do {
        pCVar22 = (ContextState *)*ppIVar23;
        (*(code *)((pCVar22->super_ContextOptions).cout)->_vptr_basic_ostream)(pCVar22,local_338);
        ppIVar23 = ppIVar23 + 1;
      } while (ppIVar23 != ppIVar5);
    }
  }
  run::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)pCVar22);
  uVar9 = local_358._24_8_;
  if ((anonymous_namespace)::FatalConditionHandler::altStackMem != (void *)0x0) {
    operator_delete__((anonymous_namespace)::FatalConditionHandler::altStackMem);
  }
  cVar11 = std::__basic_file<char>::is_open();
  if (cVar11 != '\0') {
    std::fstream::close();
  }
  detail::g_cs = (ContextState *)uVar9;
  is_running_in_test = 0;
  ppIVar5 = (this->p->reporters_currently_used).
            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppIVar23 = (this->p->reporters_currently_used).
                  super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppIVar23 != ppIVar5;
      ppIVar23 = ppIVar23 + 1) {
    if (*ppIVar23 != (IReporter *)0x0) {
      (*(*ppIVar23)->_vptr_IReporter[0xd])();
    }
  }
  pCVar22 = this->p;
  ppIVar23 = (pCVar22->reporters_currently_used).
             super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  if ((pCVar22->reporters_currently_used).
      super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppIVar23) {
    (pCVar22->reporters_currently_used).
    super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppIVar23;
  }
  if (((pCVar22->super_TestRunStats).numTestCasesFailed == 0) ||
     (iVar13 = 1, (pCVar22->super_ContextOptions).no_exitcode == true)) {
    iVar13 = 0;
  }
  if ((ostream *)local_358._0_8_ != (ostream *)0x0) {
    operator_delete((void *)local_358._0_8_,local_358._16_8_ - local_358._0_8_);
  }
  std::
  _Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
  ::~_Rb_tree((_Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
               *)local_270);
  if (local_378._M_current != (TestCase **)0x0) {
    operator_delete(local_378._M_current,local_368 - (long)local_378._M_current);
  }
LAB_0010fbc8:
  std::fstream::~fstream(local_248.buf + 8);
  return iVar13;
}

Assistant:

int Context::run() {
    using namespace detail;

    // save the old context state in case such was setup - for using asserts out of a testing context
    auto old_cs = g_cs;
    // this is the current contest
    g_cs               = p;
    is_running_in_test = true;

    g_no_colors = p->no_colors;
    p->resetRunData();

    std::fstream fstr;
    if(p->cout == nullptr) {
        if(p->quiet) {
            p->cout = &discardOut;
        } else if(p->out.size()) {
            // to a file if specified
            fstr.open(p->out.c_str(), std::fstream::out);
            p->cout = &fstr;
        } else {
            // stdout by default
            p->cout = &std::cout;
        }
    }

    FatalConditionHandler::allocateAltStackMem();

    auto cleanup_and_return = [&]() {
        FatalConditionHandler::freeAltStackMem();

        if(fstr.is_open())
            fstr.close();

        // restore context
        g_cs               = old_cs;
        is_running_in_test = false;

        // we have to free the reporters which were allocated when the run started
        for(auto& curr : p->reporters_currently_used)
            delete curr;
        p->reporters_currently_used.clear();

        if(p->numTestCasesFailed && !p->no_exitcode)
            return EXIT_FAILURE;
        return EXIT_SUCCESS;
    };

    // setup default reporter if none is given through the command line
    if(p->filters[8].empty())
        p->filters[8].push_back("console");

    // check to see if any of the registered reporters has been selected
    for(auto& curr : getReporters()) {
        if(matchesAny(curr.first.second.c_str(), p->filters[8], false, p->case_sensitive))
            p->reporters_currently_used.push_back(curr.second(*g_cs));
    }

    // TODO: check if there is nothing in reporters_currently_used

    // prepend all listeners
    for(auto& curr : getListeners())
        p->reporters_currently_used.insert(p->reporters_currently_used.begin(), curr.second(*g_cs));

#ifdef DOCTEST_PLATFORM_WINDOWS
    if(isDebuggerActive() && p->no_debug_output == false)
        p->reporters_currently_used.push_back(new DebugOutputWindowReporter(*g_cs));
#endif // DOCTEST_PLATFORM_WINDOWS

    // handle version, help and no_run
    if(p->no_run || p->version || p->help || p->list_reporters) {
        DOCTEST_ITERATE_THROUGH_REPORTERS(report_query, QueryData());

        return cleanup_and_return();
    }

    std::vector<const TestCase*> testArray;
    for(auto& curr : getRegisteredTests())
        testArray.push_back(&curr);
    p->numTestCases = testArray.size();

    // sort the collected records
    if(!testArray.empty()) {
        if(p->order_by.compare("file", true) == 0) {
            std::sort(testArray.begin(), testArray.end(), fileOrderComparator);
        } else if(p->order_by.compare("suite", true) == 0) {
            std::sort(testArray.begin(), testArray.end(), suiteOrderComparator);
        } else if(p->order_by.compare("name", true) == 0) {
            std::sort(testArray.begin(), testArray.end(), nameOrderComparator);
        } else if(p->order_by.compare("rand", true) == 0) {
            std::srand(p->rand_seed);

            // random_shuffle implementation
            const auto first = &testArray[0];
            for(size_t i = testArray.size() - 1; i > 0; --i) {
                int idxToSwap = std::rand() % (i + 1); // NOLINT

                const auto temp = first[i];

                first[i]         = first[idxToSwap];
                first[idxToSwap] = temp;
            }
        } else if(p->order_by.compare("none", true) == 0) {
            // means no sorting - beneficial for death tests which call into the executable
            // with a specific test case in mind - we don't want to slow down the startup times
        }
    }

    std::set<String> testSuitesPassingFilt;

    bool                             query_mode = p->count || p->list_test_cases || p->list_test_suites;
    std::vector<const TestCaseData*> queryResults;

    if(!query_mode)
        DOCTEST_ITERATE_THROUGH_REPORTERS(test_run_start, DOCTEST_EMPTY);

    // invoke the registered functions if they match the filter criteria (or just count them)
    for(auto& curr : testArray) {
        const auto& tc = *curr;

        bool skip_me = false;
        if(tc.m_skip && !p->no_skip)
            skip_me = true;

        if(!matchesAny(tc.m_file.c_str(), p->filters[0], true, p->case_sensitive))
            skip_me = true;
        if(matchesAny(tc.m_file.c_str(), p->filters[1], false, p->case_sensitive))
            skip_me = true;
        if(!matchesAny(tc.m_test_suite, p->filters[2], true, p->case_sensitive))
            skip_me = true;
        if(matchesAny(tc.m_test_suite, p->filters[3], false, p->case_sensitive))
            skip_me = true;
        if(!matchesAny(tc.m_name, p->filters[4], true, p->case_sensitive))
            skip_me = true;
        if(matchesAny(tc.m_name, p->filters[5], false, p->case_sensitive))
            skip_me = true;

        if(!skip_me)
            p->numTestCasesPassingFilters++;

        // skip the test if it is not in the execution range
        if((p->last < p->numTestCasesPassingFilters && p->first <= p->last) ||
           (p->first > p->numTestCasesPassingFilters))
            skip_me = true;

        if(skip_me) {
            if(!query_mode)
                DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_skipped, tc);
            continue;
        }

        // do not execute the test if we are to only count the number of filter passing tests
        if(p->count)
            continue;

        // print the name of the test and don't execute it
        if(p->list_test_cases) {
            queryResults.push_back(&tc);
            continue;
        }

        // print the name of the test suite if not done already and don't execute it
        if(p->list_test_suites) {
            if((testSuitesPassingFilt.count(tc.m_test_suite) == 0) && tc.m_test_suite[0] != '\0') {
                queryResults.push_back(&tc);
                testSuitesPassingFilt.insert(tc.m_test_suite);
                p->numTestSuitesPassingFilters++;
            }
            continue;
        }

        // execute the test if it passes all the filtering
        {
            p->currentTest = &tc;

            p->failure_flags = TestCaseFailureReason::None;
            p->seconds       = 0;

            // reset atomic counters
            p->numAssertsFailedCurrentTest_atomic = 0;
            p->numAssertsCurrentTest_atomic       = 0;

            p->subcasesPassed.clear();

            DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_start, tc);

            p->timer.start();
            
            bool run_test = true;

            do {
                // reset some of the fields for subcases (except for the set of fully passed ones)
                p->should_reenter          = false;
                p->subcasesCurrentMaxLevel = 0;
                p->subcasesStack.clear();

                p->shouldLogCurrentException = true;

                // reset stuff for logging with INFO()
                p->stringifiedContexts.clear();

#ifndef DOCTEST_CONFIG_NO_EXCEPTIONS
                try {
#endif // DOCTEST_CONFIG_NO_EXCEPTIONS
// MSVC 2015 diagnoses fatalConditionHandler as unused (because reset() is a static method)
DOCTEST_MSVC_SUPPRESS_WARNING_WITH_PUSH(4101) // unreferenced local variable
                    FatalConditionHandler fatalConditionHandler; // Handle signals
                    // execute the test
                    tc.m_test();
                    fatalConditionHandler.reset();
DOCTEST_MSVC_SUPPRESS_WARNING_POP
#ifndef DOCTEST_CONFIG_NO_EXCEPTIONS
                } catch(const TestFailureException&) {
                    p->failure_flags |= TestCaseFailureReason::AssertFailure;
                } catch(...) {
                    DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_exception,
                                                      {translateActiveException(), false});
                    p->failure_flags |= TestCaseFailureReason::Exception;
                }
#endif // DOCTEST_CONFIG_NO_EXCEPTIONS

                // exit this loop if enough assertions have failed - even if there are more subcases
                if(p->abort_after > 0 &&
                   p->numAssertsFailed + p->numAssertsFailedCurrentTest_atomic >= p->abort_after) {
                    run_test = false;
                    p->failure_flags |= TestCaseFailureReason::TooManyFailedAsserts;
                }
                
                if(p->should_reenter && run_test)
                    DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_reenter, tc);
                if(!p->should_reenter)
                    run_test = false;
            } while(run_test);

            p->finalizeTestCaseData();

            DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_end, *g_cs);

            p->currentTest = nullptr;

            // stop executing tests if enough assertions have failed
            if(p->abort_after > 0 && p->numAssertsFailed >= p->abort_after)
                break;
        }
    }

    if(!query_mode) {
        DOCTEST_ITERATE_THROUGH_REPORTERS(test_run_end, *g_cs);
    } else {
        QueryData qdata;
        qdata.run_stats = g_cs;
        qdata.data      = queryResults.data();
        qdata.num_data  = unsigned(queryResults.size());
        DOCTEST_ITERATE_THROUGH_REPORTERS(report_query, qdata);
    }

    // see these issues on the reasoning for this:
    // - https://github.com/onqtam/doctest/issues/143#issuecomment-414418903
    // - https://github.com/onqtam/doctest/issues/126
    auto DOCTEST_FIX_FOR_MACOS_LIBCPP_IOSFWD_STRING_LINK_ERRORS = []() DOCTEST_NOINLINE
        { std::cout << std::string(); };
    DOCTEST_FIX_FOR_MACOS_LIBCPP_IOSFWD_STRING_LINK_ERRORS();

    return cleanup_and_return();
}